

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

int32_t uprv_strCompare_63(UChar *s1,int32_t length1,UChar *s2,int32_t length2,UBool strncmpStyle,
                          UBool codePointOrder)

{
  uint uVar1;
  UChar *t;
  UChar *pUVar2;
  UChar *pUVar3;
  long lVar4;
  UChar *pUVar5;
  UChar UVar6;
  int iVar7;
  UChar *pUVar8;
  UChar UVar9;
  long lVar10;
  
  pUVar5 = s1;
  pUVar8 = s2;
  if ((length2 & length1) < 0) {
    if (s1 == s2) {
      uVar1 = 0;
    }
    else {
      UVar6 = *s1;
      UVar9 = *s2;
      if (UVar6 == UVar9) {
        pUVar3 = (UChar *)0x0;
        do {
          if (UVar6 == L'\0') {
            return 0;
          }
          UVar6 = pUVar5[1];
          pUVar5 = pUVar5 + 1;
          UVar9 = pUVar8[1];
          pUVar8 = pUVar8 + 1;
        } while (UVar6 == UVar9);
        pUVar2 = (UChar *)0x0;
      }
      else {
        pUVar2 = (UChar *)0x0;
        pUVar3 = (UChar *)0x0;
      }
LAB_0010f1af:
      if (((codePointOrder != '\0') && (0xd7ff < (ushort)UVar6)) && (0xd7ff < (ushort)UVar9)) {
        if ((((0xdbff < (ushort)UVar6) || (pUVar5 + 1 == pUVar2)) ||
            ((pUVar5[1] & 0xfc00U) != 0xdc00)) &&
           ((pUVar5 == s1 || (UVar6 & 0xfc00U) != 0xdc00 || ((pUVar5[-1] & 0xfc00U) != 0xd800)))) {
          UVar6 = UVar6 + L'\xd800';
        }
        if ((((0xdbff < (ushort)UVar9) || (pUVar8 + 1 == pUVar3)) ||
            ((pUVar8[1] & 0xfc00U) != 0xdc00)) &&
           ((pUVar8 == s2 || (UVar9 & 0xfc00U) != 0xdc00 || ((pUVar8[-1] & 0xfc00U) != 0xd800)))) {
          UVar9 = UVar9 + L'\xd800';
        }
      }
      uVar1 = (uint)(ushort)UVar6 - (uint)(ushort)UVar9;
    }
  }
  else if (strncmpStyle == '\0') {
    if (length1 < 0) {
      length1 = -1;
      pUVar2 = s1;
      do {
        length1 = length1 + 1;
        UVar6 = *pUVar2;
        pUVar2 = pUVar2 + 1;
      } while (UVar6 != L'\0');
    }
    if (length2 < 0) {
      length2 = -1;
      pUVar2 = s2;
      do {
        length2 = length2 + 1;
        UVar6 = *pUVar2;
        pUVar2 = pUVar2 + 1;
      } while (UVar6 != L'\0');
    }
    iVar7 = length2;
    if (length1 < length2) {
      iVar7 = length1;
    }
    uVar1 = 0xffffffff;
    if (length2 <= length1) {
      uVar1 = (uint)(length1 != length2);
    }
    if (iVar7 != 0 && s1 != s2) {
      lVar10 = (long)iVar7 * 2;
      do {
        UVar6 = *pUVar5;
        UVar9 = *pUVar8;
        if (UVar6 != UVar9) {
          pUVar2 = s1 + length1;
          pUVar3 = s2 + length2;
          goto LAB_0010f1af;
        }
        pUVar5 = pUVar5 + 1;
        pUVar8 = pUVar8 + 1;
        lVar10 = lVar10 + -2;
      } while (lVar10 != 0);
    }
  }
  else {
    uVar1 = 0;
    if ((s1 != s2) && (length1 != 0)) {
      lVar4 = (long)length1;
      pUVar2 = s1 + lVar4;
      lVar10 = lVar4 * 2;
      do {
        lVar10 = lVar10 + -2;
        UVar6 = *pUVar5;
        UVar9 = *pUVar8;
        if (UVar6 != UVar9) {
          pUVar3 = s2 + lVar4;
          goto LAB_0010f1af;
        }
        if (UVar6 == L'\0') {
          return 0;
        }
        pUVar5 = pUVar5 + 1;
        pUVar8 = pUVar8 + 1;
        uVar1 = 0;
      } while (lVar10 != 0);
    }
  }
  return uVar1;
}

Assistant:

U_CFUNC int32_t U_EXPORT2
uprv_strCompare(const UChar *s1, int32_t length1,
                const UChar *s2, int32_t length2,
                UBool strncmpStyle, UBool codePointOrder) {
    const UChar *start1, *start2, *limit1, *limit2;
    UChar c1, c2;

    /* setup for fix-up */
    start1=s1;
    start2=s2;

    /* compare identical prefixes - they do not need to be fixed up */
    if(length1<0 && length2<0) {
        /* strcmp style, both NUL-terminated */
        if(s1==s2) {
            return 0;
        }

        for(;;) {
            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            if(c1==0) {
                return 0;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit1=limit2=NULL;
    } else if(strncmpStyle) {
        /* special handling for strncmp, assume length1==length2>=0 but also check for NUL */
        if(s1==s2) {
            return 0;
        }

        limit1=start1+length1;

        for(;;) {
            /* both lengths are same, check only one limit */
            if(s1==limit1) {
                return 0;
            }

            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            if(c1==0) {
                return 0;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit2=start2+length1; /* use length1 here, too, to enforce assumption */
    } else {
        /* memcmp/UnicodeString style, both length-specified */
        int32_t lengthResult;

        if(length1<0) {
            length1=u_strlen(s1);
        }
        if(length2<0) {
            length2=u_strlen(s2);
        }

        /* limit1=start1+min(lenght1, length2) */
        if(length1<length2) {
            lengthResult=-1;
            limit1=start1+length1;
        } else if(length1==length2) {
            lengthResult=0;
            limit1=start1+length1;
        } else /* length1>length2 */ {
            lengthResult=1;
            limit1=start1+length2;
        }

        if(s1==s2) {
            return lengthResult;
        }

        for(;;) {
            /* check pseudo-limit */
            if(s1==limit1) {
                return lengthResult;
            }

            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit1=start1+length1;
        limit2=start2+length2;
    }

    /* if both values are in or above the surrogate range, fix them up */
    if(c1>=0xd800 && c2>=0xd800 && codePointOrder) {
        /* subtract 0x2800 from BMP code points to make them smaller than supplementary ones */
        if(
            (c1<=0xdbff && (s1+1)!=limit1 && U16_IS_TRAIL(*(s1+1))) ||
            (U16_IS_TRAIL(c1) && start1!=s1 && U16_IS_LEAD(*(s1-1)))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c1-=0x2800;
        }

        if(
            (c2<=0xdbff && (s2+1)!=limit2 && U16_IS_TRAIL(*(s2+1))) ||
            (U16_IS_TRAIL(c2) && start2!=s2 && U16_IS_LEAD(*(s2-1)))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c2-=0x2800;
        }
    }

    /* now c1 and c2 are in the requested (code unit or code point) order */
    return (int32_t)c1-(int32_t)c2;
}